

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

char * lua_setupvalue(lua_State *L,int funcindex,int n)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  StkId pTVar10;
  undefined1 uVar11;
  int iVar12;
  TValue *io2;
  TValue *io1;
  int compatible;
  StkId input;
  TString *usertype;
  TValue *pTStack_40;
  ravi_type_map type;
  StkId fi;
  UpVal *uv;
  CClosure *owner;
  TValue *val;
  char *name;
  int n_local;
  int funcindex_local;
  lua_State *L_local;
  
  owner = (CClosure *)0x0;
  uv = (UpVal *)0x0;
  fi = (StkId)0x0;
  iVar12 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar12 + 1;
  name._0_4_ = n;
  name._4_4_ = funcindex;
  _n_local = L;
  if (iVar12 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x658,"const char *lua_setupvalue(lua_State *, int, int)");
  }
  pTStack_40 = index2addr(L,funcindex);
  if ((long)_n_local->top - (long)_n_local->ci->func >> 4 < 2) {
    __assert_fail("((1) < (L->top - L->ci->func)) && \"not enough elements in the stack\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x65a,"const char *lua_setupvalue(lua_State *, int, int)");
  }
  val = (TValue *)
        aux_upvalue(pTStack_40,(int)name,(TValue **)&owner,(CClosure **)&uv,(UpVal **)&fi,
                    (ravi_type_map *)((long)&usertype + 4),(TString **)&input);
  if ((val != (TValue *)0x0) &&
     (iVar12 = raviV_checktype(_n_local,_n_local->top + -1,usertype._4_4_,(TString *)input),
     iVar12 == 0)) {
    val = (TValue *)0x0;
  }
  if (val != (TValue *)0x0) {
    _n_local->top = _n_local->top + -1;
    pTVar10 = _n_local->top;
    owner->next = (GCObject *)pTVar10->value_;
    uVar11 = *(undefined1 *)((long)&pTVar10->tt_ + 1);
    owner->tt = *(undefined1 *)&pTVar10->tt_;
    owner->marked = uVar11;
    uVar1._0_1_ = owner->tt;
    uVar1._1_1_ = owner->marked;
    if ((uVar1 & 0x8000) != 0) {
      uVar2._0_1_ = owner->tt;
      uVar2._1_1_ = owner->marked;
      uVar3._0_1_ = owner->tt;
      uVar3._1_1_ = owner->marked;
      if ((uVar3 & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x66a,"const char *lua_setupvalue(lua_State *, int, int)");
      }
      if ((uVar2 & 0x7f) != (ushort)owner->next->tt) {
LAB_0011f9ea:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x66a,"const char *lua_setupvalue(lua_State *, int, int)");
      }
      if (_n_local != (lua_State *)0x0) {
        uVar4._0_1_ = owner->tt;
        uVar4._1_1_ = owner->marked;
        if ((uVar4 & 0x8000) == 0) {
          __assert_fail("(((io1)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x66a,"const char *lua_setupvalue(lua_State *, int, int)");
        }
        if ((owner->next->marked & (_n_local->l_G->currentwhite ^ 0x18)) != 0) goto LAB_0011f9ea;
      }
    }
    if (uv == (UpVal *)0x0) {
      if (((fi != (StkId)0x0) &&
          (uVar8._0_1_ = owner->tt, uVar8._1_1_ = owner->marked, (uVar8 & 0x8000) != 0)) &&
         ((fi->value_).gc == (GCObject *)(fi + 1))) {
        uVar9._0_1_ = owner->tt;
        uVar9._1_1_ = owner->marked;
        if ((uVar9 & 0x8000) == 0) {
          __assert_fail("(((val)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x66c,"const char *lua_setupvalue(lua_State *, int, int)");
        }
        luaC_upvalbarrier_(_n_local,owner->next);
      }
    }
    else {
      uVar5._0_1_ = owner->tt;
      uVar5._1_1_ = owner->marked;
      if (((uVar5 & 0x8000) != 0) && ((uv->refcount & 0x2000) != 0)) {
        uVar6._0_1_ = owner->tt;
        uVar6._1_1_ = owner->marked;
        if ((uVar6 & 0x8000) == 0) {
          __assert_fail("(((val)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x66b,"const char *lua_setupvalue(lua_State *, int, int)");
        }
        if ((owner->next->marked & 0x18) != 0) {
          if (9 < ((byte)uv->refcount & 0xf)) {
            __assert_fail("(((owner)->tt) & 0x0F) < (9+1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                          ,0x66b,"const char *lua_setupvalue(lua_State *, int, int)");
          }
          uVar7._0_1_ = owner->tt;
          uVar7._1_1_ = owner->marked;
          if ((uVar7 & 0x8000) == 0) {
            __assert_fail("(((val)->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                          ,0x66b,"const char *lua_setupvalue(lua_State *, int, int)");
          }
          luaC_barrier_(_n_local,(GCObject *)uv,owner->next);
        }
      }
    }
  }
  iVar12 = **(int **)&_n_local[-1].hookmask + -1;
  **(int **)&_n_local[-1].hookmask = iVar12;
  if (iVar12 == 0) {
    return (char *)val;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x66e,"const char *lua_setupvalue(lua_State *, int, int)");
}

Assistant:

LUA_API const char *lua_setupvalue (lua_State *L, int funcindex, int n) {
  const char *name;
  TValue *val = NULL;  /* to avoid warnings */
  CClosure *owner = NULL;
  UpVal *uv = NULL;
  StkId fi;
  ravi_type_map type; /* RAVI upvalue type will be obtained if possible */
  TString *usertype;
  lua_lock(L);
  fi = index2addr(L, funcindex);
  api_checknelems(L, 1);
  name = aux_upvalue(fi, n, &val, &owner, &uv, &type, &usertype);
  if (name) {
    /* RAVI extension
    ** We need to ensure that this function does
    ** not subvert the types of local variables
    */
  
    StkId input = L->top - 1;
    int compatible = raviV_checktype(L, input, type, usertype);
          
    if (!compatible)
      name = NULL;
  }
  if (name) {
    L->top--;
    setobj(L, val, L->top);
    if (owner) { luaC_barrier(L, owner, val); }
    else if (uv) { luaC_upvalbarrier(L, uv, val); }
  }
  lua_unlock(L);
  return name;
}